

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4m_video_source.h
# Opt level: O3

void __thiscall libaom_test::Y4mVideoSource::~Y4mVideoSource(Y4mVideoSource *this)

{
  aom_image *paVar1;
  pointer pcVar2;
  
  (this->super_VideoSource)._vptr_VideoSource = (_func_int **)&PTR__Y4mVideoSource_00ff7a98;
  aom_img_free((this->img_)._M_t.super___uniq_ptr_impl<aom_image,_std::default_delete<aom_image>_>.
               _M_t.super__Tuple_impl<0UL,_aom_image_*,_std::default_delete<aom_image>_>.
               super__Head_base<0UL,_aom_image_*,_false>._M_head_impl);
  CloseSource(this);
  paVar1 = (this->img_)._M_t.super___uniq_ptr_impl<aom_image,_std::default_delete<aom_image>_>._M_t.
           super__Tuple_impl<0UL,_aom_image_*,_std::default_delete<aom_image>_>.
           super__Head_base<0UL,_aom_image_*,_false>._M_head_impl;
  if (paVar1 != (aom_image *)0x0) {
    operator_delete(paVar1);
  }
  (this->img_)._M_t.super___uniq_ptr_impl<aom_image,_std::default_delete<aom_image>_>._M_t.
  super__Tuple_impl<0UL,_aom_image_*,_std::default_delete<aom_image>_>.
  super__Head_base<0UL,_aom_image_*,_false>._M_head_impl = (aom_image *)0x0;
  pcVar2 = (this->file_name_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->file_name_).field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

~Y4mVideoSource() override {
    aom_img_free(img_.get());
    CloseSource();
  }